

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guardedTests.cpp
# Opt level: O1

void __thiscall guarded_guarded_2_Test::~guarded_guarded_2_Test(guarded_guarded_2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(guarded, guarded_2)
{
    guarded<int> data(0);

    std::thread th1([&data]() {
        for (int i = 0; i < 10000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 10000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    th1.join();
    th2.join();

    auto data_handle = data.lock();

    EXPECT_EQ(*data_handle, 20000);
}